

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

int aom_satd_sse2(tran_low_t *coeff,int length)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar7 = 0;
  iVar8 = 0;
  iVar9 = 0;
  iVar10 = 0;
  if (0 < length) {
    lVar6 = 0;
    do {
      puVar1 = (uint *)(coeff + lVar6);
      uVar3 = (int)*puVar1 >> 0x1f;
      uVar4 = (int)puVar1[1] >> 0x1f;
      uVar5 = (int)puVar1[2] >> 0x1f;
      uVar2 = (int)puVar1[3] >> 0x1f;
      iVar7 = (uVar3 ^ *puVar1) + (iVar7 - uVar3);
      iVar8 = (uVar4 ^ puVar1[1]) + (iVar8 - uVar4);
      iVar9 = (uVar5 ^ puVar1[2]) + (iVar9 - uVar5);
      iVar10 = (uVar2 ^ puVar1[3]) + (iVar10 - uVar2);
      lVar6 = lVar6 + 4;
    } while ((int)lVar6 < length);
  }
  return iVar10 + iVar8 + iVar9 + iVar7;
}

Assistant:

int aom_satd_sse2(const tran_low_t *coeff, int length) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  __m128i accum = zero;

  for (i = 0; i < length; i += 4) {
    const __m128i src_line = _mm_load_si128((const __m128i *)coeff);
    const __m128i coeff_sign = _mm_srai_epi32(src_line, 31);
    const __m128i abs_coeff = invert_sign_32_sse2(src_line, coeff_sign);
    accum = _mm_add_epi32(accum, abs_coeff);
    coeff += 4;
  }

  {  // cascading summation of accum
    __m128i hi = _mm_srli_si128(accum, 8);
    accum = _mm_add_epi32(accum, hi);
    hi = _mm_srli_epi64(accum, 32);
    accum = _mm_add_epi32(accum, hi);
  }

  return _mm_cvtsi128_si32(accum);
}